

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O0

bool tinyusdz::tydra::PrimToPrimSpecImpl<tinyusdz::Xform>(Xform *p,PrimSpec *ps,string *err)

{
  Specifier SVar1;
  string *this;
  Specifier *pSVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  *this_00;
  map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
  *this_01;
  PrimMeta *this_02;
  Property local_8c0;
  undefined1 local_2e0 [8];
  Attribute xformOpOrderAttr;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> toks;
  string *err_local;
  PrimSpec *ps_local;
  Xform *p_local;
  
  this = PrimSpec::name_abi_cxx11_(ps);
  ::std::__cxx11::string::operator=((string *)this,(string *)&(p->super_GPrim).name);
  SVar1 = (p->super_GPrim).spec;
  pSVar2 = PrimSpec::specifier(ps);
  *pSVar2 = SVar1;
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
             *)PrimSpec::props_abi_cxx11_(ps);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
  ::operator=(this_00,&(p->super_GPrim).props);
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
             &xformOpOrderAttr._metas.stringData.
              super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Attribute::Attribute((Attribute *)local_2e0);
  Attribute::set_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
            ((Attribute *)local_2e0,
             (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
             &xformOpOrderAttr._metas.stringData.
              super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  this_01 = (map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
             *)PrimSpec::props_abi_cxx11_(ps);
  Property::Property(&local_8c0,(Attribute *)local_2e0,false);
  ::std::
  map<std::__cxx11::string,tinyusdz::Property,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::Property>>>
  ::emplace<char_const(&)[13],tinyusdz::Property>(this_01,(char (*) [13])"xformOpOrder",&local_8c0);
  Property::~Property(&local_8c0);
  this_02 = PrimSpec::metas(ps);
  PrimMetas::operator=(this_02,&(p->super_GPrim).meta);
  Attribute::~Attribute((Attribute *)local_2e0);
  ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
            ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
             &xformOpOrderAttr._metas.stringData.
              super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return true;
}

Assistant:

bool PrimToPrimSpecImpl(const Xform &p, PrimSpec &ps, std::string *err) {
  (void)err;

  ps.name() = p.name;
  ps.specifier() = p.spec;

  ps.props() = p.props;

  // TODO..
  std::vector<value::token> toks;
  Attribute xformOpOrderAttr;
  xformOpOrderAttr.set_value(toks);
  ps.props().emplace("xformOpOrder",
                     Property(xformOpOrderAttr, /* custom */ false));

  ps.metas() = p.meta;

  // TODO: variantSet
  // ps.variantSets

  return true;
}